

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,string *source,string *destination,MatchProperties match_properties)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  cmExecutionStatus *pcVar3;
  cmFileCopier *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Status SVar8;
  size_t sVar9;
  unsigned_long uVar10;
  char *pcVar11;
  ostream *poVar12;
  mode_t permissions_00;
  unsigned_long dindex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  Directory dir;
  mode_t permissions;
  string fromPath;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  string toPath;
  ostringstream e;
  Directory DStack_258;
  mode_t local_250;
  mode_t local_24c;
  char *local_248;
  char *pcStack_240;
  char local_238;
  undefined7 uStack_237;
  cmFileCopier *local_218;
  string *local_210;
  string *local_208;
  unsigned_long local_200;
  string local_1f8;
  mode_t *local_1d8;
  mode_t local_1cc;
  string local_1c8;
  undefined1 local_1a8 [16];
  char *local_198;
  char *pcStack_190;
  size_t local_188;
  char *local_180;
  ios_base local_138 [264];
  
  bVar5 = cmsys::SystemTools::FileIsDirectory(destination);
  bVar6 = true;
  if (bVar5) {
    bVar6 = cmsys::SystemTools::FileIsSymlink(destination);
  }
  (*this->_vptr_cmFileCopier[5])(this,destination,1,(ulong)bVar6);
  local_1d8 = &local_1cc;
  local_1cc = 0;
  bVar5 = GetDefaultDirectoryPermissions(this,&local_1d8);
  if (bVar5) {
    SVar8 = cmsys::SystemTools::MakeDirectory(destination,local_1d8);
    local_218 = this;
    if (SVar8.Kind_ == Success) {
      local_24c = match_properties.Permissions;
      if ((ulong)match_properties >> 0x20 == 0) {
        local_24c = this->DirPermissions;
      }
      if (local_24c == 0) {
        cmsys::SystemTools::GetPermissions(source,&local_24c);
      }
      permissions_00 = local_24c | 0x1c0;
      local_250 = local_24c;
      if ((~local_24c & 0x1c0) == 0) {
        local_250 = 0;
        permissions_00 = local_24c;
      }
      bVar5 = SetPermissions(this,destination,permissions_00);
      if (bVar5) {
        cmsys::Directory::Directory(&DStack_258);
        if (source->_M_string_length != 0) {
          cmsys::Directory::Load(&DStack_258,source,(string *)0x0);
        }
        uVar10 = cmsys::Directory::GetNumberOfFiles(&DStack_258);
        if (uVar10 != 0) {
          dindex = 0;
          local_210 = destination;
          local_208 = source;
          local_200 = uVar10;
          do {
            pcVar11 = cmsys::Directory::GetFile(&DStack_258,dindex);
            if (((*pcVar11 != '.') || (pcVar11[1] != '\0')) &&
               ((pcVar11 = cmsys::Directory::GetFile(&DStack_258,dindex), *pcVar11 != '.' ||
                ((pcVar11[1] != '.' || (pcVar11[2] != '\0')))))) {
              pcVar1 = (source->_M_dataplus)._M_p;
              pp_Var2 = (_func_int **)source->_M_string_length;
              local_248 = (char *)0x1;
              pcStack_240 = &local_238;
              local_238 = '/';
              pcVar11 = cmsys::Directory::GetFile(&DStack_258,dindex);
              local_198 = local_248;
              pcStack_190 = pcStack_240;
              local_1a8._0_8_ = pp_Var2;
              local_1a8._8_8_ = pcVar1;
              local_188 = strlen(pcVar11);
              views._M_len = 3;
              views._M_array = (iterator)local_1a8;
              local_180 = pcVar11;
              cmCatViews_abi_cxx11_(&local_1f8,views);
              pcVar1 = (local_210->_M_dataplus)._M_p;
              pp_Var2 = (_func_int **)local_210->_M_string_length;
              local_248 = (char *)0x1;
              pcStack_240 = &local_238;
              local_238 = '/';
              pcVar11 = cmsys::Directory::GetFile(&DStack_258,dindex);
              local_198 = local_248;
              pcStack_190 = pcStack_240;
              local_1a8._0_8_ = pp_Var2;
              local_1a8._8_8_ = pcVar1;
              local_188 = strlen(pcVar11);
              views_00._M_len = 3;
              views_00._M_array = (iterator)local_1a8;
              local_180 = pcVar11;
              cmCatViews_abi_cxx11_(&local_1c8,views_00);
              this = local_218;
              iVar7 = (*local_218->_vptr_cmFileCopier[3])(local_218,&local_1f8,&local_1c8);
              source = local_208;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              uVar10 = local_200;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              destination = local_210;
              if ((char)iVar7 == '\0') {
                bVar5 = false;
                goto LAB_003c59f3;
              }
            }
            dindex = dindex + 1;
          } while (uVar10 != dindex);
        }
        bVar5 = SetPermissions(this,destination,local_250);
LAB_003c59f3:
        cmsys::Directory::~Directory(&DStack_258);
        return bVar5;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      pcVar11 = this->Name;
      if (pcVar11 == (char *)0x0) {
        std::ios::clear((int)&DStack_258 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0xb0);
      }
      else {
        sVar9 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," cannot make directory \"",0x18);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(destination->_M_dataplus)._M_p,
                           destination->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\": ",3);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      pcVar4 = local_218;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_248,(long)pcStack_240);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,".",1);
      if (local_248 != &local_238) {
        operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
      }
      pcVar3 = pcVar4->Status;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pcVar3->Error);
      if (local_248 != &local_238) {
        operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  return false;
}

Assistant:

bool cmFileCopier::InstallDirectory(const std::string& source,
                                    const std::string& destination,
                                    MatchProperties match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !( // Report "Up-to-date:" for existing directories,
                      // but not symlinks to them.
                     cmSystemTools::FileIsDirectory(destination) &&
                     !cmSystemTools::FileIsSymlink(destination)));

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  // Make sure the destination directory exists.
  if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination
      << "\": " << cmSystemTools::GetLastSystemError() << ".";
    this->Status.SetError(e.str());
    return false;
  }

  // Compute the requested permissions for the destination directory.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->DirPermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
  }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if ((permissions & required_permissions) == required_permissions) {
    permissions_before = permissions;
  } else {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
  }

  // Set the required permissions of the destination directory.
  if (!this->SetPermissions(destination, permissions_before)) {
    return false;
  }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if (!source.empty()) {
    dir.Load(source);
  }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for (unsigned long fileNum = 0; fileNum < numFiles; ++fileNum) {
    if (!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
          strcmp(dir.GetFile(fileNum), "..") == 0)) {
      std::string fromPath = cmStrCat(source, '/', dir.GetFile(fileNum));
      std::string toPath = cmStrCat(destination, '/', dir.GetFile(fileNum));
      if (!this->Install(fromPath, toPath)) {
        return false;
      }
    }
  }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}